

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int GetAllValuesPololu(POLOLU *pPololu,int *selectedchannels,int *ais)

{
  int iVar1;
  int local_43c;
  int local_438;
  int nbselectedchannels;
  int index;
  int channel;
  int recvbuflen;
  int sendbuflen;
  uchar recvbuf [512];
  uchar sendbuf [512];
  int *ais_local;
  int *selectedchannels_local;
  POLOLU *pPololu_local;
  
  memset(recvbuf + 0x1f8,0,0x200);
  local_43c = 0;
  local_438 = 0;
  for (nbselectedchannels = 0; nbselectedchannels < 0x18;
      nbselectedchannels = nbselectedchannels + 1) {
    if (selectedchannels[nbselectedchannels] != 0) {
      recvbuf[(long)local_438 + 0x1f8] = 0xaa;
      recvbuf[(long)(local_438 + 1) + 0x1f8] = (uchar)pPololu->DeviceNumber;
      recvbuf[(long)(local_438 + 2) + 0x1f8] = '\x10';
      recvbuf[(long)(local_438 + 3) + 0x1f8] = (uchar)nbselectedchannels;
      local_43c = local_43c + 1;
      local_438 = local_438 + 4;
    }
  }
  if (local_43c == 0) {
    pPololu_local._4_4_ = 0;
  }
  else {
    iVar1 = WriteAllRS232Port(&pPololu->RS232Port,recvbuf + 0x1f8,local_43c << 2);
    if (iVar1 == 0) {
      if ((pPololu->bSaveRawData != 0) && (pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf + 0x1f8,(long)(local_43c << 2),1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      mSleep(10);
      memset(&recvbuflen,0,0x200);
      iVar1 = ReadAllRS232Port(&pPololu->RS232Port,(uint8 *)&recvbuflen,local_43c << 1);
      if (iVar1 == 0) {
        if ((pPololu->bSaveRawData != 0) && (pPololu->pfSaveFile != (FILE *)0x0)) {
          fwrite(&recvbuflen,(long)(local_43c << 1),1,(FILE *)pPololu->pfSaveFile);
          fflush((FILE *)pPololu->pfSaveFile);
        }
        memset(ais,0,0x60);
        local_438 = 0;
        for (nbselectedchannels = 0; nbselectedchannels < 0x18;
            nbselectedchannels = nbselectedchannels + 1) {
          if (selectedchannels[nbselectedchannels] != 0) {
            ais[nbselectedchannels] =
                 (uint)*(byte *)((long)&recvbuflen + (long)local_438) +
                 (uint)*(byte *)((long)&recvbuflen + (long)(local_438 + 1)) * 0x100;
            pPololu->LastAIs[nbselectedchannels] = ais[nbselectedchannels];
            local_438 = local_438 + 2;
          }
        }
        pPololu_local._4_4_ = 0;
      }
      else {
        pPololu_local._4_4_ = 1;
      }
    }
    else {
      pPololu_local._4_4_ = 1;
    }
  }
  return pPololu_local._4_4_;
}

Assistant:

inline int GetAllValuesPololu(POLOLU* pPololu, int* selectedchannels, int* ais)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	unsigned char recvbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int recvbuflen = 0;
	int channel = 0;
	int index = 0, nbselectedchannels = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	nbselectedchannels = 0;
	index = 0;

	for (channel = 0; channel < NB_CHANNELS_AI_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		sendbuf[index] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[index+1] = (unsigned char)pPololu->DeviceNumber;
		sendbuf[index+2] = (unsigned char)(GET_POSITION_COMMAND_POLOLU & 0x7F);
		sendbuf[index+3] = (unsigned char)channel;	
		nbselectedchannels++;
		index += 4;
	}

	if (nbselectedchannels == 0) return EXIT_SUCCESS;

	sendbuflen = 4*nbselectedchannels;

	//printf("%s\n", sendbuf);

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	mSleep(10); // Added because sometimes there was a timeout on the read() 
	// (even though the data were available if read just after the timeout...)...

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2*nbselectedchannels;

	if (ReadAllRS232Port(&pPololu->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}
	
	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);

	memset(ais, 0, NB_CHANNELS_AI_POLOLU*sizeof(int));
	index = 0;

	for (channel = 0; channel < NB_CHANNELS_AI_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		ais[channel] = recvbuf[index] + 256*recvbuf[index+1];

		// Update last known value.
		pPololu->LastAIs[channel] = ais[channel];
				
		index += 2;
	}

	return EXIT_SUCCESS;
}